

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# directed_flag_complex_in_memory_computer.h
# Opt level: O0

void directed_flag_complex_in_memory_computer::
     prepare_graph_filtration<directed_flag_complex_in_memory_t<std::pair<int,float>>>
               (directed_flag_complex_in_memory_t<std::pair<int,_float>_> *complex,
               filtered_directed_graph_t *graph,filtration_algorithm_t *filtration_algorithm,
               size_t nb_threads)

{
  bool bVar1;
  size_type sVar2;
  ulong uVar3;
  ostream *poVar4;
  size_t sVar5;
  reference _new_edges;
  reference puVar6;
  reference pvVar7;
  reference pfVar8;
  size_type sVar9;
  reference pvVar10;
  vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  *in_RCX;
  long *in_RDX;
  ushort *in_RSI;
  value_type vVar11;
  float f;
  iterator __end4;
  iterator __begin4;
  value_type *__range4;
  unsigned_short e;
  iterator __end3;
  iterator __begin3;
  value_type *__range3;
  size_t i_1;
  size_t current_edge_index;
  size_t current_filtration_index;
  size_t i;
  vector<directed_flag_complex_in_memory_computer::reorder_edges_t,_std::allocator<directed_flag_complex_in_memory_computer::reorder_edges_t>_>
  reorder_filtration;
  vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  new_filtrations;
  vector<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>
  new_edges;
  size_t index;
  value_t *filtration;
  vertex_index_t *edge;
  compute_filtration_t compute_filtration;
  bool computed_edge_filtration;
  vertex_index_t v;
  directed_flag_complex_cell_t cell;
  compute_filtration_t *in_stack_fffffffffffffdc8;
  float in_stack_fffffffffffffdd0;
  undefined2 in_stack_fffffffffffffdd4;
  unsigned_short in_stack_fffffffffffffdd6;
  directed_flag_complex_in_memory_t<std::pair<int,_float>_> *in_stack_fffffffffffffdd8;
  pair<int,_float> in_stack_fffffffffffffde0;
  undefined7 in_stack_fffffffffffffde8;
  undefined1 in_stack_fffffffffffffdef;
  vector<float,_std::allocator<float>_> *in_stack_fffffffffffffdf0;
  vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  *this;
  __normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_> local_1a8;
  undefined8 in_stack_fffffffffffffe60;
  undefined6 in_stack_fffffffffffffe68;
  undefined2 in_stack_fffffffffffffe6e;
  directed_flag_complex_in_memory_t<std::pair<int,_float>_> *in_stack_fffffffffffffe70;
  __normal_iterator<unsigned_short_*,_std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>
  local_188;
  reference local_180;
  vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  *local_178;
  undefined8 in_stack_fffffffffffffe90;
  compute_filtration_t *in_stack_fffffffffffffe98;
  size_type __n;
  directed_flag_complex_in_memory_t<std::pair<int,_float>_> *in_stack_fffffffffffffea0;
  vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  *local_148;
  vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  local_120;
  vector<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>
  local_100;
  undefined4 local_e4;
  pair<int,_float> local_e0;
  ulong local_d8;
  reference local_d0;
  reference local_c8;
  byte local_63;
  vertex_index_t local_62;
  directed_flag_complex_cell_t local_60 [2];
  undefined4 local_3c;
  vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  *local_20;
  long *local_18;
  ushort *local_10;
  
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  if (in_RDX == (long *)0x0) {
    std::vector<float,_std::allocator<float>_>::size
              ((vector<float,_std::allocator<float>_> *)(in_RSI + 0x54));
    local_3c = 0;
    std::allocator<float>::allocator((allocator<float> *)0x1d02fc);
    std::vector<float,_std::allocator<float>_>::vector
              (in_stack_fffffffffffffdf0,
               CONCAT17(in_stack_fffffffffffffdef,in_stack_fffffffffffffde8),
               (value_type_conflict2 *)in_stack_fffffffffffffde0,
               (allocator_type *)in_stack_fffffffffffffdd8);
    std::vector<float,_std::allocator<float>_>::operator=
              ((vector<float,_std::allocator<float>_> *)in_stack_fffffffffffffde0,
               (vector<float,_std::allocator<float>_> *)in_stack_fffffffffffffdd8);
    std::vector<float,_std::allocator<float>_>::~vector
              ((vector<float,_std::allocator<float>_> *)in_stack_fffffffffffffde0);
    std::allocator<float>::~allocator((allocator<float> *)0x1d0353);
  }
  else {
    uVar3 = (**(code **)(*in_RDX + 0x18))();
    if ((uVar3 & 1) != 0) {
      directed_flag_complex_cell_t::directed_flag_complex_cell_t(local_60);
      for (local_62 = 0; local_62 < *local_10; local_62 = local_62 + 1) {
        directed_flag_complex_cell_t::set_vertices(local_60,&local_62);
        vVar11 = (value_type)(**(code **)(*local_18 + 0x10))(local_18,0,local_60,local_10,0);
        pvVar10 = std::vector<float,_std::allocator<float>_>::operator[]
                            ((vector<float,_std::allocator<float>_> *)(local_10 + 0x54),
                             (ulong)local_62);
        *pvVar10 = vVar11;
      }
    }
  }
  local_63 = 0;
  if ((local_18 != (long *)0x0) &&
     ((sVar2 = std::vector<float,_std::allocator<float>_>::size
                         ((vector<float,_std::allocator<float>_> *)(local_10 + 0x60)), sVar2 == 0 ||
      (uVar3 = (**(code **)(*local_18 + 0x20))(), (uVar3 & 1) != 0)))) {
    local_63 = 1;
    poVar4 = std::operator<<((ostream *)&std::cout,"\x1b[K");
    poVar4 = std::operator<<(poVar4,"computing the filtration of all edges");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,std::flush<char,std::char_traits<char>>);
    std::operator<<(poVar4,"\r");
    compute_filtration_t::compute_filtration_t
              ((compute_filtration_t *)in_stack_fffffffffffffde0,
               (filtration_algorithm_t *)in_stack_fffffffffffffdd8,
               (filtered_directed_graph_t *)
               CONCAT26(in_stack_fffffffffffffdd6,
                        CONCAT24(in_stack_fffffffffffffdd4,in_stack_fffffffffffffdd0)),
               (directed_flag_complex_in_memory_t<std::pair<int,_float>_> *)
               in_stack_fffffffffffffdc8);
    directed_flag_complex_in_memory_t<std::pair<int,_float>_>::
    for_each_cell<directed_flag_complex_in_memory_computer::compute_filtration_t>
              (in_stack_fffffffffffffea0,in_stack_fffffffffffffe98,
               (int)((ulong)in_stack_fffffffffffffe90 >> 0x20),(int)in_stack_fffffffffffffe90);
    std::vector<float,_std::allocator<float>_>::clear
              ((vector<float,_std::allocator<float>_> *)0x1d0532);
    compute_filtration_t::filtration(in_stack_fffffffffffffdc8);
    std::vector<float,_std::allocator<float>_>::operator=
              ((vector<float,_std::allocator<float>_> *)in_stack_fffffffffffffde0,
               (vector<float,_std::allocator<float>_> *)in_stack_fffffffffffffdd8);
    std::vector<float,_std::allocator<float>_>::~vector
              ((vector<float,_std::allocator<float>_> *)in_stack_fffffffffffffde0);
    compute_filtration_t::~compute_filtration_t((compute_filtration_t *)0x1d057f);
  }
  if (((local_63 & 1) == 0) && (local_18 != (long *)0x0)) {
    local_c8 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::operator[]
                         ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)(local_10 + 4),
                          0);
    local_d0 = std::vector<float,_std::allocator<float>_>::operator[]
                         ((vector<float,_std::allocator<float>_> *)(local_10 + 0x60),0);
    for (local_d8 = 0; uVar3 = local_d8,
        sVar5 = directed_graph_t::edge_number((directed_graph_t *)0x1d0627), uVar3 < sVar5;
        local_d8 = local_d8 + 1) {
      local_e4 = 0xffffffff;
      local_e0 = std::make_pair<int,float&>
                           (&in_stack_fffffffffffffdc8->current_index,(float *)0x1d0672);
      directed_flag_complex_in_memory_t<std::pair<int,float>>::set_data<unsigned_short*>
                (in_stack_fffffffffffffdd8,
                 CONCAT22(in_stack_fffffffffffffdd6,in_stack_fffffffffffffdd4),
                 (unsigned_short *)in_stack_fffffffffffffdc8,in_stack_fffffffffffffde0);
      local_c8 = local_c8 + 2;
      local_d0 = local_d0 + 1;
    }
  }
  std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>::allocator
            ((allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_> *)0x1d06f8);
  std::
  vector<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>
  ::vector((vector<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>
            *)in_stack_fffffffffffffdf0,
           CONCAT17(in_stack_fffffffffffffdef,in_stack_fffffffffffffde8),
           (allocator_type *)in_stack_fffffffffffffde0);
  std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>::~allocator
            ((allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_> *)0x1d071e);
  this = local_20;
  std::allocator<std::vector<float,_std::allocator<float>_>_>::allocator
            ((allocator<std::vector<float,_std::allocator<float>_>_> *)0x1d073d);
  std::
  vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  ::vector(this,CONCAT17(in_stack_fffffffffffffdef,in_stack_fffffffffffffde8),
           (allocator_type *)in_stack_fffffffffffffde0);
  std::allocator<std::vector<float,_std::allocator<float>_>_>::~allocator
            ((allocator<std::vector<float,_std::allocator<float>_>_> *)0x1d0763);
  std::
  vector<directed_flag_complex_in_memory_computer::reorder_edges_t,_std::allocator<directed_flag_complex_in_memory_computer::reorder_edges_t>_>
  ::vector((vector<directed_flag_complex_in_memory_computer::reorder_edges_t,_std::allocator<directed_flag_complex_in_memory_computer::reorder_edges_t>_>
            *)0x1d0770);
  for (local_148 = (vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                    *)0x0; local_148 < local_20;
      local_148 = (vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                   *)((long)&(local_148->
                             super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                             )._M_impl.super__Vector_impl_data._M_start + 1)) {
    _new_edges = std::
                 vector<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>
                 ::operator[](&local_100,(size_type)local_148);
    in_stack_fffffffffffffde0 =
         (pair<int,_float>)
         std::
         vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
         ::operator[](&local_120,(size_type)local_148);
    reorder_edges_t::reorder_edges_t
              ((reorder_edges_t *)&stack0xfffffffffffffea0,_new_edges,
               (vector<float,_std::allocator<float>_> *)in_stack_fffffffffffffde0,
               (local_63 & 1) == 0 && local_18 != (long *)0x0);
    std::
    vector<directed_flag_complex_in_memory_computer::reorder_edges_t,_std::allocator<directed_flag_complex_in_memory_computer::reorder_edges_t>_>
    ::push_back((vector<directed_flag_complex_in_memory_computer::reorder_edges_t,_std::allocator<directed_flag_complex_in_memory_computer::reorder_edges_t>_>
                 *)CONCAT26(in_stack_fffffffffffffdd6,
                            CONCAT24(in_stack_fffffffffffffdd4,in_stack_fffffffffffffdd0)),
                (value_type *)in_stack_fffffffffffffdc8);
  }
  directed_flag_complex_in_memory_t<std::pair<int,_float>_>::
  for_each_cell<directed_flag_complex_in_memory_computer::reorder_edges_t>
            (in_stack_fffffffffffffe70,
             (vector<directed_flag_complex_in_memory_computer::reorder_edges_t,_std::allocator<directed_flag_complex_in_memory_computer::reorder_edges_t>_>
              *)CONCAT26(in_stack_fffffffffffffe6e,in_stack_fffffffffffffe68),
             (int)((ulong)in_stack_fffffffffffffe60 >> 0x20),(int)in_stack_fffffffffffffe60);
  __n = 0;
  sVar2 = 0;
  for (local_178 = (vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                    *)0x0; local_178 < local_20;
      local_178 = (vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                   *)((long)&(local_178->
                             super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                             )._M_impl.super__Vector_impl_data._M_start + 1)) {
    local_180 = std::
                vector<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>
                ::operator[](&local_100,(size_type)local_178);
    local_188._M_current =
         (unsigned_short *)
         std::vector<unsigned_short,_std::allocator<unsigned_short>_>::begin
                   ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)
                    in_stack_fffffffffffffdc8);
    std::vector<unsigned_short,_std::allocator<unsigned_short>_>::end
              ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)in_stack_fffffffffffffdc8)
    ;
    while (bVar1 = __gnu_cxx::operator!=
                             ((__normal_iterator<unsigned_short_*,_std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>
                               *)CONCAT26(in_stack_fffffffffffffdd6,
                                          CONCAT24(in_stack_fffffffffffffdd4,
                                                   in_stack_fffffffffffffdd0)),
                              (__normal_iterator<unsigned_short_*,_std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>
                               *)in_stack_fffffffffffffdc8), bVar1) {
      puVar6 = __gnu_cxx::
               __normal_iterator<unsigned_short_*,_std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>
               ::operator*(&local_188);
      in_stack_fffffffffffffdd6 = *puVar6;
      sVar9 = sVar2 + 1;
      pvVar7 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::operator[]
                         ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)(local_10 + 4),
                          sVar2);
      *pvVar7 = in_stack_fffffffffffffdd6;
      __gnu_cxx::
      __normal_iterator<unsigned_short_*,_std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>
      ::operator++(&local_188);
      sVar2 = sVar9;
    }
    if (((local_63 & 1) == 0) && (local_18 != (long *)0x0)) {
      std::
      vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
      ::operator[](&local_120,(size_type)local_178);
      local_1a8._M_current =
           (float *)std::vector<float,_std::allocator<float>_>::begin
                              ((vector<float,_std::allocator<float>_> *)in_stack_fffffffffffffdc8);
      std::vector<float,_std::allocator<float>_>::end
                ((vector<float,_std::allocator<float>_> *)in_stack_fffffffffffffdc8);
      while (bVar1 = __gnu_cxx::operator!=
                               ((__normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_>
                                 *)CONCAT26(in_stack_fffffffffffffdd6,
                                            CONCAT24(in_stack_fffffffffffffdd4,
                                                     in_stack_fffffffffffffdd0)),
                                (__normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_>
                                 *)in_stack_fffffffffffffdc8), bVar1) {
        pfVar8 = __gnu_cxx::__normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_>
                 ::operator*(&local_1a8);
        in_stack_fffffffffffffdd0 = *pfVar8;
        sVar9 = __n + 1;
        pvVar10 = std::vector<float,_std::allocator<float>_>::operator[]
                            ((vector<float,_std::allocator<float>_> *)(local_10 + 0x60),__n);
        *pvVar10 = in_stack_fffffffffffffdd0;
        __gnu_cxx::__normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_>::
        operator++(&local_1a8);
        __n = sVar9;
      }
    }
  }
  std::
  vector<directed_flag_complex_in_memory_computer::reorder_edges_t,_std::allocator<directed_flag_complex_in_memory_computer::reorder_edges_t>_>
  ::~vector((vector<directed_flag_complex_in_memory_computer::reorder_edges_t,_std::allocator<directed_flag_complex_in_memory_computer::reorder_edges_t>_>
             *)in_stack_fffffffffffffde0);
  std::
  vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  ::~vector((vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
             *)in_stack_fffffffffffffde0);
  std::
  vector<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>
  ::~vector((vector<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>
             *)in_stack_fffffffffffffde0);
  return;
}

Assistant:

void prepare_graph_filtration(Complex& complex, filtered_directed_graph_t& graph,
                              filtration_algorithm_t* filtration_algorithm, const size_t nb_threads) {
	if (filtration_algorithm == nullptr) {
		// All vertices get the trivial filtration value
		graph.vertex_filtration = std::vector<value_t>(graph.vertex_filtration.size(), 0);
	} else {
		if (filtration_algorithm->overwrite_vertex_filtration()) {
			directed_flag_complex_cell_t cell;
			for (vertex_index_t v = 0; v < graph.number_of_vertices; v++) {
				cell.set_vertices(&v);
				graph.vertex_filtration[v] = filtration_algorithm->compute_filtration(0, cell, graph, nullptr);
			}
		}
	}

	bool computed_edge_filtration = false;
	if (filtration_algorithm != nullptr &&
	    (graph.edge_filtration.size() == 0 || filtration_algorithm->overwrite_edge_filtration())) {
		computed_edge_filtration = true;
#ifdef INDICATE_PROGRESS
		std::cout << "\033[K"
		          << "computing the filtration of all edges" << std::flush << "\r";
#endif

		compute_filtration_t compute_filtration(filtration_algorithm, graph, complex);
		complex.for_each_cell(compute_filtration, 1);
		graph.edge_filtration.clear();
		graph.edge_filtration = compute_filtration.filtration();
	}

	// Reorder the edge filtration
	if (!computed_edge_filtration && filtration_algorithm != nullptr) {
		vertex_index_t* edge = &graph.edges[0];
		value_t* filtration = &graph.edge_filtration[0];
		for (size_t index = 0; index < graph.edge_number(); ++index, edge += 2, ++filtration) {
			complex.set_data(1, edge, std::make_pair(-1, *filtration));
		}
	}

	// Now reorder the edges
	std::vector<std::vector<vertex_index_t>> new_edges(nb_threads);
	std::vector<std::vector<value_t>> new_filtrations(nb_threads);
	std::vector<reorder_edges_t> reorder_filtration;
	for (size_t i = 0; i < nb_threads; i++)
		reorder_filtration.push_back(reorder_edges_t(new_edges[i], new_filtrations[i],
		                                             !computed_edge_filtration && filtration_algorithm != nullptr));
	complex.for_each_cell(reorder_filtration, 1);

	size_t current_filtration_index = 0;
	size_t current_edge_index = 0;
	for (size_t i = 0; i < nb_threads; i++) {
		for (auto e : new_edges[i]) graph.edges[current_edge_index++] = e;
		if (!computed_edge_filtration && filtration_algorithm != nullptr)
			for (auto f : new_filtrations[i]) graph.edge_filtration[current_filtration_index++] = f;
	}
}